

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t
zesGetDriverExpProcAddrTable(ze_api_version_t version,zes_driver_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_result_t zVar3;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (puVar1 != puVar4) {
    if (pDdiTable == (zes_driver_exp_dditable_t *)0x0) {
      zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
      if ((int)version <= *(int *)(loader::context + 0x15c0)) {
        zVar3 = ZE_RESULT_SUCCESS;
        do {
          if (*(int *)(puVar4 + 1) == 0) {
            UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar4,"zesGetDriverExpProcAddrTable");
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar3 = (*UNRECOVERED_JUMPTABLE)(version,puVar4 + 0x141);
            }
          }
          puVar4 = puVar4 + 0x1b3;
        } while (puVar4 != puVar1);
        if (zVar3 == ZE_RESULT_SUCCESS) {
          lVar2 = **(long **)(loader::context + 0x1610);
          UNRECOVERED_JUMPTABLE = loader::zesDriverGetDeviceByUuidExp;
          if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b
                      ) < 2) && (*(char *)(loader::context + 0x1629) == '\0')) {
            UNRECOVERED_JUMPTABLE = *(code **)(lVar2 + 0xa08);
          }
          pDdiTable->pfnGetDeviceByUuidExp = UNRECOVERED_JUMPTABLE;
          if (*(long *)(loader::context + 0x1618) == 0) {
            zVar3 = ZE_RESULT_SUCCESS;
          }
          else {
            UNRECOVERED_JUMPTABLE =
                 (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetDriverExpProcAddrTable");
            zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar3 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
              return zVar3;
            }
          }
        }
      }
    }
  }
  return zVar3;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetDriverExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_driver_exp_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetDriverExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetDriverExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.zes.DriverExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetDeviceByUuidExp                       = loader::zesDriverGetDeviceByUuidExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.DriverExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetDriverExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetDriverExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}